

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

int __thiscall
testing::internal::UnitTestImpl::FilterTests(UnitTestImpl *this,ReactionToSharding shard_tests)

{
  pointer ppTVar1;
  TestSuite *pTVar2;
  pointer ppTVar3;
  TestInfo *pTVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  pointer ppTVar8;
  byte bVar9;
  undefined4 in_register_00000034;
  string *filter;
  pointer ppTVar10;
  int iVar11;
  bool bVar12;
  undefined1 local_180 [8];
  PositiveAndNegativeUnitTestFilter gtest_flag_filter;
  UnitTestFilter disable_test_filter;
  int local_40;
  int local_3c;
  allocator<char> local_31;
  
  filter = (string *)CONCAT44(in_register_00000034,shard_tests);
  if (shard_tests == HONOR_SHARDING_PROTOCOL) {
    local_3c = Int32FromEnvOrDie("GTEST_TOTAL_SHARDS",-1);
    filter = (string *)0xffffffff;
    iVar7 = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
  }
  else {
    iVar7 = -1;
    local_3c = iVar7;
  }
  anon_unknown_28::PositiveAndNegativeUnitTestFilter::PositiveAndNegativeUnitTestFilter
            ((PositiveAndNegativeUnitTestFilter *)local_180,filter);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&disable_test_filter.exact_match_patterns_._M_h._M_single_bucket,
             "DISABLED_*:*/DISABLED_*",&local_31);
  anon_unknown_28::UnitTestFilter::UnitTestFilter
            ((UnitTestFilter *)
             &gtest_flag_filter.negative_filter_.exact_match_patterns_._M_h._M_single_bucket,
             (string *)&disable_test_filter.exact_match_patterns_._M_h._M_single_bucket);
  std::__cxx11::string::~string
            ((string *)&disable_test_filter.exact_match_patterns_._M_h._M_single_bucket);
  ppTVar8 = (this->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar1 = (this->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_40 = 0;
  iVar11 = 0;
  for (; ppTVar8 != ppTVar1; ppTVar8 = ppTVar8 + 1) {
    pTVar2 = *ppTVar8;
    pTVar2->should_run_ = false;
    ppTVar3 = (pTVar2->test_info_list_).
              super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppTVar10 = (pTVar2->test_info_list_).
                    super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppTVar10 != ppTVar3;
        ppTVar10 = ppTVar10 + 1) {
      pTVar4 = *ppTVar10;
      bVar5 = anon_unknown_28::UnitTestFilter::MatchesName
                        ((UnitTestFilter *)
                         &gtest_flag_filter.negative_filter_.exact_match_patterns_._M_h.
                          _M_single_bucket,&pTVar2->name_);
      bVar6 = true;
      if (!bVar5) {
        bVar6 = anon_unknown_28::UnitTestFilter::MatchesName
                          ((UnitTestFilter *)
                           &gtest_flag_filter.negative_filter_.exact_match_patterns_._M_h.
                            _M_single_bucket,&pTVar4->name_);
      }
      pTVar4->is_disabled_ = bVar6;
      bVar5 = anon_unknown_28::PositiveAndNegativeUnitTestFilter::MatchesTest
                        ((PositiveAndNegativeUnitTestFilter *)local_180,&pTVar2->name_,
                         &pTVar4->name_);
      pTVar4->matches_filter_ = bVar5;
      bVar12 = iVar11 % local_3c != iVar7;
      bVar9 = bVar5 & (bVar6 ^ 1U | FLAGS_gtest_also_run_disabled_tests);
      pTVar4->is_in_another_shard_ = shard_tests != IGNORE_SHARDING_PROTOCOL && bVar12;
      bVar5 = (bool)((shard_tests == IGNORE_SHARDING_PROTOCOL || !bVar12) & bVar9);
      iVar11 = iVar11 + (uint)bVar9;
      local_40 = local_40 + (uint)bVar5;
      pTVar4->should_run_ = bVar5;
      pTVar2->should_run_ = (bool)(pTVar2->should_run_ | bVar5);
    }
  }
  anon_unknown_28::UnitTestFilter::~UnitTestFilter
            ((UnitTestFilter *)
             &gtest_flag_filter.negative_filter_.exact_match_patterns_._M_h._M_single_bucket);
  anon_unknown_28::PositiveAndNegativeUnitTestFilter::~PositiveAndNegativeUnitTestFilter
            ((PositiveAndNegativeUnitTestFilter *)local_180);
  return local_40;
}

Assistant:

int UnitTestImpl::FilterTests(ReactionToSharding shard_tests) {
  const int32_t total_shards = shard_tests == HONOR_SHARDING_PROTOCOL
                                   ? Int32FromEnvOrDie(kTestTotalShards, -1)
                                   : -1;
  const int32_t shard_index = shard_tests == HONOR_SHARDING_PROTOCOL
                                  ? Int32FromEnvOrDie(kTestShardIndex, -1)
                                  : -1;

  const PositiveAndNegativeUnitTestFilter gtest_flag_filter(
      GTEST_FLAG_GET(filter));
  const UnitTestFilter disable_test_filter(kDisableTestFilter);
  // num_runnable_tests are the number of tests that will
  // run across all shards (i.e., match filter and are not disabled).
  // num_selected_tests are the number of tests to be run on
  // this shard.
  int num_runnable_tests = 0;
  int num_selected_tests = 0;
  for (auto* test_suite : test_suites_) {
    const std::string& test_suite_name = test_suite->name_;
    test_suite->set_should_run(false);

    for (TestInfo* test_info : test_suite->test_info_list()) {
      const std::string& test_name = test_info->name_;
      // A test is disabled if test suite name or test name matches
      // kDisableTestFilter.
      const bool is_disabled =
          disable_test_filter.MatchesName(test_suite_name) ||
          disable_test_filter.MatchesName(test_name);
      test_info->is_disabled_ = is_disabled;

      const bool matches_filter =
          gtest_flag_filter.MatchesTest(test_suite_name, test_name);
      test_info->matches_filter_ = matches_filter;

      const bool is_runnable =
          (GTEST_FLAG_GET(also_run_disabled_tests) || !is_disabled) &&
          matches_filter;

      const bool is_in_another_shard =
          shard_tests != IGNORE_SHARDING_PROTOCOL &&
          !ShouldRunTestOnShard(total_shards, shard_index, num_runnable_tests);
      test_info->is_in_another_shard_ = is_in_another_shard;
      const bool is_selected = is_runnable && !is_in_another_shard;

      num_runnable_tests += is_runnable;
      num_selected_tests += is_selected;

      test_info->should_run_ = is_selected;
      test_suite->set_should_run(test_suite->should_run() || is_selected);
    }
  }
  return num_selected_tests;
}